

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvim.cpp
# Opt level: O2

void __thiscall
nvim::Nvim::buf_set_lines
          (Nvim *this,Buffer buffer,Integer start,Integer end,bool strict_indexing,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *replacement)

{
  allocator local_6a;
  bool strict_indexing_local;
  Buffer buffer_local;
  Integer end_local;
  Integer start_local;
  string local_50;
  
  strict_indexing_local = strict_indexing;
  buffer_local = buffer;
  end_local = end;
  start_local = start;
  std::__cxx11::string::string((string *)&local_50,"nvim_buf_set_lines",&local_6a);
  NvimRPC::
  call<long,long,long,bool,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&this->client_,&local_50,(nullptr_t)0x0,&buffer_local,&start_local,&end_local,
             &strict_indexing_local,replacement);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void Nvim::buf_set_lines(Buffer buffer, Integer start, Integer end, bool strict_indexing, const std::vector<std::string>& replacement) {
    client_.call("nvim_buf_set_lines", nullptr, buffer, start, end, strict_indexing, replacement);
}